

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeDisplay.cpp
# Opt level: O2

void __thiscall eglu::NativeDisplay::NativeDisplay(NativeDisplay *this,Capability capabilities)

{
  allocator<char> local_1;
  
  this->_vptr_NativeDisplay = (_func_int **)&PTR__NativeDisplay_01e112a8;
  this->m_capabilities = capabilities;
  this->m_platformType = 0x3038;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_platformExtension,glcts::fixed_sample_locations_values + 1,&local_1)
  ;
  return;
}

Assistant:

NativeDisplay::NativeDisplay (Capability capabilities)
	: m_capabilities		(capabilities)
	, m_platformType		(EGL_NONE)
	, m_platformExtension	("")
{
	DE_ASSERT(!(capabilities & CAPABILITY_GET_DISPLAY_PLATFORM));
	DE_ASSERT(capabilities & CAPABILITY_GET_DISPLAY_LEGACY);
}